

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  FileDescriptor *pFVar1;
  Nonnull<const_char_*> pcVar2;
  long v2;
  long v1;
  long lVar3;
  string_view text;
  
  pFVar1 = this->file_;
  if (0 < pFVar1->service_count_) {
    lVar3 = 0;
    v1 = 0;
    do {
      PrintServiceClass(this,(ServiceDescriptor *)(&pFVar1->services_->super_SymbolBase + lVar3));
      pFVar1 = this->file_;
      v2 = (long)pFVar1->service_count_;
      if (v1 < v2) {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,v2,"index < service_count()");
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) {
        PrintServices();
      }
      PrintServiceStub(this,(ServiceDescriptor *)(&pFVar1->services_->super_SymbolBase + lVar3));
      text._M_str = "\n";
      text._M_len = 1;
      io::Printer::Print<>(this->printer_,text);
      v1 = v1 + 1;
      pFVar1 = this->file_;
      lVar3 = lVar3 + 0x40;
    } while (v1 < pFVar1->service_count_);
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}